

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall
QTextCursor::insertMarkdown(QTextCursor *this,QString *markdown,MarkdownFeatures features)

{
  QLatin1StringView latin1;
  bool bVar1;
  QTextCursorPrivate *pQVar2;
  ulong uVar3;
  undefined4 in_EDX;
  QLatin1String *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QTextDocumentFragment fragment;
  QSharedDataPointer<QTextCursorPrivate> *in_stack_ffffffffffffff70;
  QLatin1String *this_00;
  QLatin1String *this_01;
  QString *markdown_00;
  undefined1 in_stack_ffffffffffffffa0 [12];
  QFlagsStorage<QTextDocument::MarkdownFeature> in_stack_ffffffffffffffac;
  QLatin1Char local_43;
  ushort local_42;
  QLatin1Char local_3f;
  ushort local_3e;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined4 local_2c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  markdown_00 = in_RDI;
  local_2c = in_EDX;
  bVar1 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a6389);
  if ((!bVar1) &&
     (pQVar2 = QSharedDataPointer<QTextCursorPrivate>::operator->(in_stack_ffffffffffffff70),
     pQVar2->priv != (QTextDocumentPrivate *)0x0)) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_3c = local_2c;
    QTextDocumentFragment::fromMarkdown(markdown_00,(MarkdownFeatures)in_stack_ffffffffffffffac.i);
    this_00 = in_RSI;
    QLatin1Char::QLatin1Char(&local_3f,'\n');
    QChar::QChar<QLatin1Char,_true>((QChar *)in_RSI,(QLatin1Char)(char)((ulong)in_RDI >> 0x38));
    uVar3 = QString::startsWith((QChar)(char16_t)in_RSI,(uint)local_3e);
    if ((uVar3 & 1) != 0) {
      QTextDocument::firstBlock((QTextDocument *)this_00);
      QTextBlock::blockFormat((QTextBlock *)this_00);
      insertBlock((QTextCursor *)in_RDI,(QTextBlockFormat *)in_RSI);
      QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x7a6450);
    }
    insertFragment((QTextCursor *)this_00,(QTextDocumentFragment *)in_RDI);
    bVar1 = atEnd((QTextCursor *)in_RDI);
    if (!bVar1) {
      this_01 = this_00;
      QLatin1Char::QLatin1Char(&local_43,'\n');
      QChar::QChar<QLatin1Char,_true>((QChar *)in_RSI,(QLatin1Char)(char)((ulong)in_RDI >> 0x38));
      uVar3 = QString::endsWith((QChar)(char16_t)this_00,(uint)local_42);
      if ((uVar3 & 1) != 0) {
        QLatin1String::QLatin1String(this_01,(char *)in_RDI);
        latin1.m_data._4_4_ = in_stack_ffffffffffffffac.i;
        latin1._0_12_ = in_stack_ffffffffffffffa0;
        QString::QString((QString *)this_01,latin1);
        insertText((QTextCursor *)in_RDI,(QString *)in_RSI);
        QString::~QString((QString *)0x7a64eb);
      }
    }
    QTextDocumentFragment::~QTextDocumentFragment((QTextDocumentFragment *)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextCursor::insertMarkdown(const QString &markdown, QTextDocument::MarkdownFeatures features)
{
    if (!d || !d->priv)
        return;
    QTextDocumentFragment fragment = QTextDocumentFragment::fromMarkdown(markdown, features);
    if (markdown.startsWith(QLatin1Char('\n')))
        insertBlock(fragment.d->doc->firstBlock().blockFormat());
    insertFragment(fragment);
    if (!atEnd() && markdown.endsWith(QLatin1Char('\n')))
        insertText(QLatin1String("\n"));
}